

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blend_a64_mask_avx2.c
# Opt level: O0

void highbd_blend_a64_d16_mask_subw0_subh0_w4_avx2
               (uint16_t *dst,uint32_t dst_stride,CONV_BUF_TYPE *src0,uint32_t src0_stride,
               CONV_BUF_TYPE *src1,uint32_t src1_stride,uint8_t *mask,uint32_t mask_stride,int h,
               __m256i *round_offset,int shift,__m256i *clip_low,__m256i *clip_high,
               __m256i *mask_max)

{
  undefined1 auVar1 [16];
  uint *in_stack_00000008;
  undefined4 in_stack_00000024;
  __m128i mask08;
  int in_stack_0000014c;
  CONV_BUF_TYPE *in_stack_00000150;
  int in_stack_0000015c;
  CONV_BUF_TYPE *in_stack_00000160;
  int in_stack_0000016c;
  uint16_t *in_stack_00000170;
  undefined4 in_stack_ffffffffffffff14;
  __m256i *in_stack_ffffffffffffff30;
  
  do {
    auVar1 = vpinsrd_avx(ZEXT416(*in_stack_00000008),
                         *(undefined4 *)((long)in_stack_00000008 + ((ulong)mask & 0xffffffff)),1);
    auVar1 = vpinsrd_avx(auVar1,*(undefined4 *)
                                 ((long)in_stack_00000008 + (ulong)(uint)((int)mask * 2)),2);
    auVar1 = vpinsrd_avx(auVar1,*(undefined4 *)
                                 ((long)in_stack_00000008 + (ulong)(uint)((int)mask * 3)),3);
    vpmovzxbw_avx2(auVar1);
    highbd_blend_a64_d16_mask_w4_avx2
              (in_stack_00000170,in_stack_0000016c,in_stack_00000160,in_stack_0000015c,
               in_stack_00000150,in_stack_0000014c,(__m256i *)CONCAT44(in_stack_00000024,h),
               (__m256i *)CONCAT44(in_stack_ffffffffffffff14,round_offset._0_4_),shift,clip_low,
               clip_high,in_stack_ffffffffffffff30);
    in_stack_00000008 = (uint *)((long)in_stack_00000008 + (ulong)(uint)((int)mask << 2));
    mask_stride = mask_stride - 4;
  } while (mask_stride != 0);
  return;
}

Assistant:

static inline void highbd_blend_a64_d16_mask_subw0_subh0_w4_avx2(
    uint16_t *dst, uint32_t dst_stride, const CONV_BUF_TYPE *src0,
    uint32_t src0_stride, const CONV_BUF_TYPE *src1, uint32_t src1_stride,
    const uint8_t *mask, uint32_t mask_stride, int h,
    const __m256i *round_offset, int shift, const __m256i *clip_low,
    const __m256i *clip_high, const __m256i *mask_max) {
  do {
    // Load 8x u8 pixels from each of 4 rows of the mask, pad each to u16
    const __m128i mask08 = _mm_set_epi32(*(int32_t *)(mask + 3 * mask_stride),
                                         *(int32_t *)(mask + 2 * mask_stride),
                                         *(int32_t *)(mask + 1 * mask_stride),
                                         *(int32_t *)(mask + 0 * mask_stride));
    const __m256i mask0 = _mm256_cvtepu8_epi16(mask08);

    highbd_blend_a64_d16_mask_w4_avx2(dst, dst_stride, src0, src0_stride, src1,
                                      src1_stride, &mask0, round_offset, shift,
                                      clip_low, clip_high, mask_max);

    dst += dst_stride * 4;
    src0 += src0_stride * 4;
    src1 += src1_stride * 4;
    mask += mask_stride * 4;
  } while (h -= 4);
}